

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O0

size_t __thiscall flow::Instr::replaceOperand(Instr *this,Value *old,Value *replacement)

{
  size_type sVar1;
  reference ppVVar2;
  size_t e;
  size_t i;
  size_t count;
  Value *replacement_local;
  Value *old_local;
  Instr *this_local;
  
  i = 0;
  e = 0;
  sVar1 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::size(&this->operands_);
  for (; e != sVar1; e = e + 1) {
    ppVVar2 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::operator[]
                        (&this->operands_,e);
    if (*ppVVar2 == old) {
      setOperand(this,e,replacement);
      i = i + 1;
    }
  }
  return i;
}

Assistant:

size_t Instr::replaceOperand(Value* old, Value* replacement) {
  size_t count = 0;

  for (size_t i = 0, e = operands_.size(); i != e; ++i) {
    if (operands_[i] == old) {
      setOperand(i, replacement);
      ++count;
    }
  }

  return count;
}